

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

size_t xdirname(char *dp,char *path,size_t dplen)

{
  char *pcVar1;
  size_t local_430;
  size_t len;
  char ts [1024];
  size_t dplen_local;
  char *path_local;
  char *dp_local;
  
  strlcpy(&len,path,0x400);
  pcVar1 = dirname((char *)&len);
  local_430 = strlcpy(dp,pcVar1,dplen);
  if (((dplen != 0) && (*dp == '/')) && (dp[1] == '\0')) {
    *dp = '\0';
    local_430 = 0;
  }
  return local_430;
}

Assistant:

size_t
xdirname(char *dp, const char *path, size_t dplen)
{
	char ts[NFILEN];
	size_t len;

	(void)strlcpy(ts, path, NFILEN);
	len = strlcpy(dp, dirname(ts), dplen);
	if (dplen > 0 && dp[0] == '/' && dp[1] == '\0') {
		dp[0] = '\0';
		len = 0;
	}
	return (len);
}